

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::reduceDB_Core(Solver *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  Solver *this_00;
  Clause *this_01;
  uint32_t *puVar7;
  uint *puVar8;
  long in_RDI;
  double dVar9;
  Clause *c;
  int limit;
  bool ret;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff88;
  Ref in_stack_ffffffffffffff8c;
  vec<unsigned_int> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  reduceDB_c in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  int local_24;
  reduceDB_c local_20;
  byte local_11;
  int local_10;
  int local_c;
  
  if (0 < *(int *)(in_RDI + 0x34)) {
    uVar3 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x240));
    printf("c Core size before reduce: %i\n",(ulong)uVar3);
  }
  local_11 = 0;
  this_00 = (Solver *)(in_RDI + 0x240);
  reduceDB_c::reduceDB_c(&local_20,(ClauseAllocator *)(in_RDI + 0x508));
  sort<unsigned_int,reduceDB_c>
            ((vec<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffffa0);
  local_24 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x240));
  local_24 = local_24 / 2;
  local_10 = 0;
  local_c = 0;
  while (iVar6 = local_c, iVar4 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x240)),
        iVar6 < iVar4) {
    vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x240),local_c);
    this_01 = ClauseAllocator::operator[]
                        ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    uVar5 = Clause::mark(this_01);
    if (uVar5 == 3) {
      iVar4 = Clause::lbd(this_01);
      if ((((iVar4 < 3) ||
           (bVar2 = locked(this_00,(Clause *)CONCAT44(iVar6,in_stack_ffffffffffffffb8)), bVar2)) ||
          (puVar7 = Clause::touched(this_01), *(ulong *)(in_RDI + 0xf0) <= (ulong)(*puVar7 + 100000)
          )) || (local_24 <= local_c)) {
        puVar8 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x240),local_c);
        iVar4 = local_10;
        uVar3 = *puVar8;
        local_10 = local_10 + 1;
        puVar8 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x240),iVar4);
        *puVar8 = uVar3;
        bVar2 = locked(this_00,(Clause *)CONCAT44(iVar6,in_stack_ffffffffffffffb8));
        if (((bVar2) ||
            (puVar7 = Clause::touched(this_01), (ulong)(*puVar7 + 50000) < *(ulong *)(in_RDI + 0xf0)
            )) || (iVar6 = Clause::lbd(this_01), iVar6 < 3)) {
          local_24 = local_24 + 1;
        }
      }
      else {
        vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x240),local_c);
        vec<unsigned_int>::push
                  (in_stack_ffffffffffffff90,
                   (uint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        Clause::mark(this_01,2);
        uVar1 = *(undefined8 *)(in_RDI + 0xf0);
        puVar7 = Clause::touched(this_01);
        *puVar7 = (uint32_t)uVar1;
      }
    }
    local_c = local_c + 1;
  }
  dVar9 = (double)local_10;
  iVar6 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x240));
  local_11 = dVar9 < (double)iVar6 * 0.95;
  vec<unsigned_int>::shrink((vec<unsigned_int> *)(in_RDI + 0x240),local_c - local_10);
  if (0 < *(int *)(in_RDI + 0x34)) {
    uVar3 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x240));
    printf("c Core size after reduce: %i, dropped more than 5 percent: %d\n",(ulong)uVar3,
           (ulong)(local_11 & 1));
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool Solver::reduceDB_Core()
{
    if (verbosity > 0) printf("c Core size before reduce: %i\n", learnts_core.size());
    int i, j;
    bool ret = false;
    sort(learnts_core, reduceDB_c(ca));
    int limit = learnts_core.size() / 2;

    for (i = j = 0; i < learnts_core.size(); i++) {
        Clause &c = ca[learnts_core[i]];
        if (c.mark() == CORE) {
            if (c.lbd() > 2 && !locked(c) && (c.touched() + 100000 < conflicts) && i < limit) {
                learnts_tier2.push(learnts_core[i]);
                c.mark(TIER2);
                // c.removable(true);
                // c.activity() = 0;
                c.touched() = conflicts;
                // claBumpActivity(c);
            } else {
                learnts_core[j++] = learnts_core[i];
                if (locked(c) || (c.touched() + 50000 < conflicts) || c.lbd() <= 2) {
                    limit++;
                }
            }
        }
    }
    ret = j < learnts_core.size() * 0.95;
    learnts_core.shrink(i - j);
    if (verbosity > 0)
        printf("c Core size after reduce: %i, dropped more than 5 percent: %d\n", learnts_core.size(), ret);

    return ret;
}